

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_block.cpp
# Opt level: O1

void __thiscall cfdcapi_block_GetBlockData_Test::TestBody(cfdcapi_block_GetBlockData_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *temp_txid;
  AssertionResult gtest_ar;
  char *tx;
  AssertHelper local_70;
  char *proof;
  char *prev_hash;
  int ret;
  char *block_hash;
  char *merkle_hash;
  void *block_handle;
  void *handle;
  AssertHelper local_30;
  uint32_t tx_count;
  uint32_t time_data;
  uint32_t bits;
  uint32_t nonce;
  uint32_t version;
  
  handle = (void *)0x0;
  ret = CfdCreateSimpleHandle(&handle);
  block_handle = (void *)((ulong)block_handle._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&block_handle,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&block_handle);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&block_hash,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_block.cpp"
               ,0x15,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&block_hash,(Message *)&block_handle)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&block_hash);
    if (block_handle != (void *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (block_handle != (void *)0x0)) {
        (**(code **)(*block_handle + 8))();
      }
      block_handle = (void *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  block_handle = (void *)0x0;
  ret = CfdInitializeBlockHandle
                  (handle,0,
                   "00000030957958949bad814d1666ed0d4a005c8aed6b7fd56df5d12c81d584c71e5fae2dfe391f9150dcfb06d54d4eb6621672590bf46bed6893da825c076b841794cec5414e2660ffff7f200000000001020000000001010000000000000000000000000000000000000000000000000000000000000000ffffffff0502d5000101ffffffff0200f9029500000000160014164e985d0fc92c927a66c0cbaf78e6ea389629d50000000000000000266a24aa21a9ede2f61c3f71d1defd3fa999dfa36953755c690689799962b48bebd836974e8cf90120000000000000000000000000000000000000000000000000000000000000000000000000"
                   ,&block_handle);
  block_hash = (char *)((ulong)block_hash._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&block_hash,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&block_hash);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&prev_hash,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_block.cpp"
               ,0x1b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&prev_hash,(Message *)&block_hash);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&prev_hash);
    if (block_hash != (char *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (block_hash != (char *)0x0)) {
        (**(code **)(*(long *)block_hash + 8))();
      }
      block_hash = (char *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  block_hash = (char *)0x0;
  testing::internal::CmpHelperNE<decltype(nullptr),void*>
            ((internal *)&gtest_ar,"nullptr","block_handle",&block_hash,&block_handle);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&block_hash);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&prev_hash,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_block.cpp"
               ,0x1c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&prev_hash,(Message *)&block_hash);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&prev_hash);
    if (block_hash != (char *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (block_hash != (char *)0x0)) {
        (**(code **)(*(long *)block_hash + 8))();
      }
      block_hash = (char *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if (ret == 0) {
    block_hash = (char *)0x0;
    ret = CfdGetBlockHash(handle,block_handle,&block_hash);
    prev_hash = (char *)((ulong)prev_hash & 0xffffffff00000000);
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&prev_hash,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&prev_hash);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&merkle_hash,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_block.cpp"
                 ,0x20,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&merkle_hash,(Message *)&prev_hash)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&merkle_hash);
      if (prev_hash != (char *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (prev_hash != (char *)0x0)) {
          (**(code **)(*(long *)prev_hash + 8))();
        }
        prev_hash = (char *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (ret == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&gtest_ar,
                 "\"53fd7b794cf751a148b2be637df6c7daf663f1be509cb35294bd69400fdc694e\"","block_hash"
                 ,"53fd7b794cf751a148b2be637df6c7daf663f1be509cb35294bd69400fdc694e",block_hash);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&prev_hash);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&merkle_hash,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_block.cpp"
                   ,0x24,pcVar2);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&merkle_hash,(Message *)&prev_hash);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&merkle_hash);
        if (prev_hash != (char *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (prev_hash != (char *)0x0)) {
            (**(code **)(*(long *)prev_hash + 8))();
          }
          prev_hash = (char *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      CfdFreeStringBuffer(block_hash);
    }
    prev_hash = (char *)0x0;
    merkle_hash = (char *)0x0;
    version = 0;
    nonce = 0;
    bits = 0;
    time_data = 0;
    ret = CfdGetBlockHeaderData
                    (handle,block_handle,&version,&prev_hash,&merkle_hash,&time_data,&bits,&nonce);
    tx = (char *)((ulong)tx._4_4_ << 0x20);
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&tx,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&tx);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&proof,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_block.cpp"
                 ,0x31,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&proof,(Message *)&tx);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&proof);
      if (tx != (char *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (tx != (char *)0x0)) {
          (**(code **)(*(long *)tx + 8))();
        }
        tx = (char *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (ret == 0) {
      tx = (char *)CONCAT44(tx._4_4_,0x30000000);
      testing::internal::CmpHelperEQ<int,unsigned_int>
                ((internal *)&gtest_ar,"805306368","version",(int *)&tx,&version);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&tx);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&proof,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_block.cpp"
                   ,0x33,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&proof,(Message *)&tx);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&proof);
        if (tx != (char *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (tx != (char *)0x0)) {
            (**(code **)(*(long *)tx + 8))();
          }
          tx = (char *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      tx = (char *)CONCAT44(tx._4_4_,0x60264e41);
      testing::internal::CmpHelperEQ<int,unsigned_int>
                ((internal *)&gtest_ar,"1613123137","time_data",(int *)&tx,&time_data);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&tx);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&proof,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_block.cpp"
                   ,0x34,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&proof,(Message *)&tx);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&proof);
        if (tx != (char *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (tx != (char *)0x0)) {
            (**(code **)(*(long *)tx + 8))();
          }
          tx = (char *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      tx = (char *)CONCAT44(tx._4_4_,0x207fffff);
      testing::internal::CmpHelperEQ<int,unsigned_int>
                ((internal *)&gtest_ar,"0x207fffff","bits",(int *)&tx,&bits);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&tx);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&proof,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_block.cpp"
                   ,0x35,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&proof,(Message *)&tx);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&proof);
        if (tx != (char *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (tx != (char *)0x0)) {
            (**(code **)(*(long *)tx + 8))();
          }
          tx = (char *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      tx = (char *)((ulong)tx & 0xffffffff00000000);
      testing::internal::CmpHelperEQ<int,unsigned_int>
                ((internal *)&gtest_ar,"0","nonce",(int *)&tx,&nonce);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&tx);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&proof,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_block.cpp"
                   ,0x36,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&proof,(Message *)&tx);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&proof);
        if (tx != (char *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (tx != (char *)0x0)) {
            (**(code **)(*(long *)tx + 8))();
          }
          tx = (char *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperSTREQ
                ((internal *)&gtest_ar,
                 "\"2dae5f1ec784d5812cd1f56dd57f6bed8a5c004a0ded66164d81ad9b94587995\"","prev_hash",
                 "2dae5f1ec784d5812cd1f56dd57f6bed8a5c004a0ded66164d81ad9b94587995",prev_hash);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&tx);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&proof,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_block.cpp"
                   ,0x39,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&proof,(Message *)&tx);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&proof);
        if (tx != (char *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (tx != (char *)0x0)) {
            (**(code **)(*(long *)tx + 8))();
          }
          tx = (char *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperSTREQ
                ((internal *)&gtest_ar,
                 "\"c5ce9417846b075c82da9368ed6bf40b59721662b64e4dd506fbdc50911f39fe\"",
                 "merkle_hash","c5ce9417846b075c82da9368ed6bf40b59721662b64e4dd506fbdc50911f39fe",
                 merkle_hash);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&tx);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&proof,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_block.cpp"
                   ,0x3c,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&proof,(Message *)&tx);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&proof);
        if (tx != (char *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (tx != (char *)0x0)) {
            (**(code **)(*(long *)tx + 8))();
          }
          tx = (char *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      CfdFreeStringBuffer(prev_hash);
      CfdFreeStringBuffer(merkle_hash);
    }
    tx = (char *)0x0;
    ret = CfdGetTransactionFromBlock
                    (handle,block_handle,
                     "c5ce9417846b075c82da9368ed6bf40b59721662b64e4dd506fbdc50911f39fe",&tx);
    proof = (char *)((ulong)proof._4_4_ << 0x20);
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&proof,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&proof);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&temp_txid,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_block.cpp"
                 ,0x43,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&temp_txid,(Message *)&proof);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&temp_txid);
      if (proof != (char *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (proof != (char *)0x0)) {
          (**(code **)(*(long *)proof + 8))();
        }
        proof = (char *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (ret == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&gtest_ar,
                 "\"020000000001010000000000000000000000000000000000000000000000000000000000000000ffffffff0502d5000101ffffffff0200f9029500000000160014164e985d0fc92c927a66c0cbaf78e6ea389629d50000000000000000266a24aa21a9ede2f61c3f71d1defd3fa999dfa36953755c690689799962b48bebd836974e8cf90120000000000000000000000000000000000000000000000000000000000000000000000000\""
                 ,"tx",
                 "020000000001010000000000000000000000000000000000000000000000000000000000000000ffffffff0502d5000101ffffffff0200f9029500000000160014164e985d0fc92c927a66c0cbaf78e6ea389629d50000000000000000266a24aa21a9ede2f61c3f71d1defd3fa999dfa36953755c690689799962b48bebd836974e8cf90120000000000000000000000000000000000000000000000000000000000000000000000000"
                 ,tx);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&proof);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&temp_txid,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_block.cpp"
                   ,0x47,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&temp_txid,(Message *)&proof);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&temp_txid);
        if (proof != (char *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (proof != (char *)0x0)) {
            (**(code **)(*(long *)proof + 8))();
          }
          proof = (char *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      CfdFreeStringBuffer(tx);
    }
    proof = (char *)0x0;
    ret = CfdGetTxOutProof(handle,block_handle,
                           "c5ce9417846b075c82da9368ed6bf40b59721662b64e4dd506fbdc50911f39fe",&proof
                          );
    temp_txid = (char *)((ulong)temp_txid._4_4_ << 0x20);
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&temp_txid,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&temp_txid);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_block.cpp"
                 ,0x4d,pcVar2);
      testing::internal::AssertHelper::operator=(&local_70,(Message *)&temp_txid);
      testing::internal::AssertHelper::~AssertHelper(&local_70);
      if (temp_txid != (char *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (temp_txid != (char *)0x0)) {
          (**(code **)(*(long *)temp_txid + 8))();
        }
        temp_txid = (char *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (ret == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&gtest_ar,
                 "\"00000030957958949bad814d1666ed0d4a005c8aed6b7fd56df5d12c81d584c71e5fae2dfe391f9150dcfb06d54d4eb6621672590bf46bed6893da825c076b841794cec5414e2660ffff7f20000000000100000001fe391f9150dcfb06d54d4eb6621672590bf46bed6893da825c076b841794cec50101\""
                 ,"proof",
                 "00000030957958949bad814d1666ed0d4a005c8aed6b7fd56df5d12c81d584c71e5fae2dfe391f9150dcfb06d54d4eb6621672590bf46bed6893da825c076b841794cec5414e2660ffff7f20000000000100000001fe391f9150dcfb06d54d4eb6621672590bf46bed6893da825c076b841794cec50101"
                 ,proof);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&temp_txid);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_70,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_block.cpp"
                   ,0x51,pcVar2);
        testing::internal::AssertHelper::operator=(&local_70,(Message *)&temp_txid);
        testing::internal::AssertHelper::~AssertHelper(&local_70);
        if (temp_txid != (char *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (temp_txid != (char *)0x0)) {
            (**(code **)(*(long *)temp_txid + 8))();
          }
          temp_txid = (char *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      CfdFreeStringBuffer(proof);
    }
    ret = CfdExistTxidInBlock(handle,block_handle,
                              "c5ce9417846b075c82da9368ed6bf40b59721662b64e4dd506fbdc50911f39fe");
    temp_txid = (char *)((ulong)temp_txid & 0xffffffff00000000);
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&temp_txid,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&temp_txid);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_block.cpp"
                 ,0x56,pcVar2);
      testing::internal::AssertHelper::operator=(&local_70,(Message *)&temp_txid);
      testing::internal::AssertHelper::~AssertHelper(&local_70);
      if (temp_txid != (char *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (temp_txid != (char *)0x0)) {
          (**(code **)(*(long *)temp_txid + 8))();
        }
        temp_txid = (char *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    ret = CfdExistTxidInBlock(handle,block_handle,
                              "7f5fb624f5cdce391362aa6befea307c4e778e008e799b40ca7119046f26ab31");
    temp_txid = (char *)CONCAT44(temp_txid._4_4_,8);
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdNotFoundError","ret",(CfdErrorCode *)&temp_txid,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&temp_txid);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_block.cpp"
                 ,0x5a,pcVar2);
      testing::internal::AssertHelper::operator=(&local_70,(Message *)&temp_txid);
      testing::internal::AssertHelper::~AssertHelper(&local_70);
      if (temp_txid != (char *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (temp_txid != (char *)0x0)) {
          (**(code **)(*(long *)temp_txid + 8))();
        }
        temp_txid = (char *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    tx_count = 0;
    ret = CfdGetTxCountInBlock(handle,block_handle,&tx_count);
    temp_txid = (char *)((ulong)temp_txid & 0xffffffff00000000);
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&temp_txid,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&temp_txid);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_block.cpp"
                 ,0x5e,pcVar2);
      testing::internal::AssertHelper::operator=(&local_70,(Message *)&temp_txid);
      testing::internal::AssertHelper::~AssertHelper(&local_70);
      if (temp_txid != (char *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (temp_txid != (char *)0x0)) {
          (**(code **)(*(long *)temp_txid + 8))();
        }
        temp_txid = (char *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    temp_txid = (char *)CONCAT44(temp_txid._4_4_,1);
    testing::internal::CmpHelperEQ<int,unsigned_int>
              ((internal *)&gtest_ar,"1","tx_count",(int *)&temp_txid,&tx_count);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&temp_txid);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_block.cpp"
                 ,0x5f,pcVar2);
      testing::internal::AssertHelper::operator=(&local_70,(Message *)&temp_txid);
      testing::internal::AssertHelper::~AssertHelper(&local_70);
      if (temp_txid != (char *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (temp_txid != (char *)0x0)) {
          (**(code **)(*(long *)temp_txid + 8))();
        }
        temp_txid = (char *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    temp_txid = (char *)0x0;
    ret = CfdGetTxidFromBlock(handle,block_handle,0,&temp_txid);
    local_70.data_ = (AssertHelperData *)((ulong)local_70.data_._4_4_ << 0x20);
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&local_70,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_70);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_30,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_block.cpp"
                 ,99,pcVar2);
      testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_30);
      if (local_70.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_70.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_70.data_ + 8))();
        }
        local_70.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (ret == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&gtest_ar,"txid","temp_txid",
                 "c5ce9417846b075c82da9368ed6bf40b59721662b64e4dd506fbdc50911f39fe",temp_txid);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_70);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_30,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_block.cpp"
                   ,0x65,pcVar2);
        testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_70);
        testing::internal::AssertHelper::~AssertHelper(&local_30);
        if (local_70.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_70.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_70.data_ + 8))();
          }
          local_70.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      CfdFreeStringBuffer(temp_txid);
    }
    ret = CfdFreeBlockHandle(handle,block_handle);
    local_70.data_ = local_70.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&local_70,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_70);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_30,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_block.cpp"
                 ,0x6a,pcVar2);
      testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_30);
      if (local_70.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_70.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_70.data_ + 8))();
        }
        local_70.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  ret = CfdGetLastErrorCode(handle);
  if (ret != 0) {
    block_hash = (char *)0x0;
    ret = CfdGetLastErrorMessage(handle,&block_hash);
    prev_hash = (char *)((ulong)prev_hash & 0xffffffff00000000);
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&prev_hash,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&prev_hash);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&merkle_hash,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_block.cpp"
                 ,0x71,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&merkle_hash,(Message *)&prev_hash)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&merkle_hash);
      if (prev_hash != (char *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (prev_hash != (char *)0x0)) {
          (**(code **)(*(long *)prev_hash + 8))();
        }
        prev_hash = (char *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    pcVar2 = "";
    testing::internal::CmpHelperSTREQ((internal *)&gtest_ar,"\"\"","str_buffer","",block_hash);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&prev_hash);
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&merkle_hash,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_block.cpp"
                 ,0x72,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&merkle_hash,(Message *)&prev_hash)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&merkle_hash);
      if (prev_hash != (char *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (prev_hash != (char *)0x0)) {
          (**(code **)(*(long *)prev_hash + 8))();
        }
        prev_hash = (char *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    CfdFreeStringBuffer(block_hash);
  }
  ret = CfdFreeHandle(handle);
  block_hash = (char *)((ulong)block_hash & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&block_hash,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&block_hash);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&prev_hash,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_block.cpp"
               ,0x78,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&prev_hash,(Message *)&block_hash);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&prev_hash);
    if (block_hash != (char *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (block_hash != (char *)0x0)) {
        (**(code **)(*(long *)block_hash + 8))();
      }
      block_hash = (char *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  return;
}

Assistant:

TEST(cfdcapi_block, GetBlockData) {
  void* handle = nullptr;
  int ret = CfdCreateSimpleHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);

  const char* block_hex = "00000030957958949bad814d1666ed0d4a005c8aed6b7fd56df5d12c81d584c71e5fae2dfe391f9150dcfb06d54d4eb6621672590bf46bed6893da825c076b841794cec5414e2660ffff7f200000000001020000000001010000000000000000000000000000000000000000000000000000000000000000ffffffff0502d5000101ffffffff0200f9029500000000160014164e985d0fc92c927a66c0cbaf78e6ea389629d50000000000000000266a24aa21a9ede2f61c3f71d1defd3fa999dfa36953755c690689799962b48bebd836974e8cf90120000000000000000000000000000000000000000000000000000000000000000000000000";
  void* block_handle = nullptr;
  ret = CfdInitializeBlockHandle(
    handle, kCfdNetworkMainnet, block_hex, &block_handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_NE(nullptr, block_handle);
  if (ret == kCfdSuccess) {
    char* block_hash = nullptr;
    ret = CfdGetBlockHash(handle, block_handle, &block_hash);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(
        "53fd7b794cf751a148b2be637df6c7daf663f1be509cb35294bd69400fdc694e",
        block_hash);
      CfdFreeStringBuffer(block_hash);
    }
    const char* txid = "c5ce9417846b075c82da9368ed6bf40b59721662b64e4dd506fbdc50911f39fe";

    char* prev_hash = nullptr;
    char* merkle_hash = nullptr;
    uint32_t version = 0;
    uint32_t nonce = 0;
    uint32_t bits = 0;
    uint32_t time_data = 0;
    ret = CfdGetBlockHeaderData(handle, block_handle, &version, &prev_hash,
        &merkle_hash, &time_data, &bits, &nonce);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_EQ(805306368, version);
      EXPECT_EQ(1613123137, time_data);
      EXPECT_EQ(0x207fffff, bits);
      EXPECT_EQ(0, nonce);
      EXPECT_STREQ(
        "2dae5f1ec784d5812cd1f56dd57f6bed8a5c004a0ded66164d81ad9b94587995",
        prev_hash);
      EXPECT_STREQ(
        "c5ce9417846b075c82da9368ed6bf40b59721662b64e4dd506fbdc50911f39fe",
        merkle_hash);
      CfdFreeStringBuffer(prev_hash);
      CfdFreeStringBuffer(merkle_hash);
    }

    char* tx = nullptr;
    ret = CfdGetTransactionFromBlock(handle, block_handle, txid, &tx);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(
        "020000000001010000000000000000000000000000000000000000000000000000000000000000ffffffff0502d5000101ffffffff0200f9029500000000160014164e985d0fc92c927a66c0cbaf78e6ea389629d50000000000000000266a24aa21a9ede2f61c3f71d1defd3fa999dfa36953755c690689799962b48bebd836974e8cf90120000000000000000000000000000000000000000000000000000000000000000000000000",
        tx);
      CfdFreeStringBuffer(tx);
    }

    char* proof = nullptr;
    ret = CfdGetTxOutProof(handle, block_handle, txid, &proof);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(
        "00000030957958949bad814d1666ed0d4a005c8aed6b7fd56df5d12c81d584c71e5fae2dfe391f9150dcfb06d54d4eb6621672590bf46bed6893da825c076b841794cec5414e2660ffff7f20000000000100000001fe391f9150dcfb06d54d4eb6621672590bf46bed6893da825c076b841794cec50101",
        proof);
      CfdFreeStringBuffer(proof);
    }

    ret = CfdExistTxidInBlock(handle, block_handle, txid);
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdExistTxidInBlock(handle, block_handle,
        "7f5fb624f5cdce391362aa6befea307c4e778e008e799b40ca7119046f26ab31");
    EXPECT_EQ(kCfdNotFoundError, ret);

    uint32_t tx_count = 0;
    ret = CfdGetTxCountInBlock(handle, block_handle, &tx_count);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(1, tx_count);

    char* temp_txid = nullptr;
    ret = CfdGetTxidFromBlock(handle, block_handle, 0, &temp_txid);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(txid, temp_txid);
      CfdFreeStringBuffer(temp_txid);
    }

    ret = CfdFreeBlockHandle(handle, block_handle);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}